

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

char helicsInputGetChar(HelicsInput inp,HelicsError *err)

{
  char cVar1;
  InputObject *pIVar2;
  
  pIVar2 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  cVar1 = '\x15';
  if (pIVar2 != (InputObject *)0x0) {
    cVar1 = helics::Input::getValueChar(pIVar2->inputPtr);
  }
  return cVar1;
}

Assistant:

char helicsInputGetChar(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return '\x15';  // NAK (negative acknowledgment) symbol
    }
    try {
        return inpObj->inputPtr->getValue<char>();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return '\x15';  // NAK (negative acknowledgment) symbol
    }
    // LCOV_EXCL_STOP
}